

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv.cc
# Opt level: O2

void btree_str_kv_set_inf_key(void *key)

{
  undefined2 *puVar1;
  
  puVar1 = (undefined2 *)malloc(2);
  *puVar1 = 0xffff;
  *(undefined2 **)key = puVar1;
  return;
}

Assistant:

void btree_str_kv_set_inf_key(void *key)
{
    void *key_ptr;
    key_len_t keylen;
    key_len_t _keylen;

    // just containing length (0xff..) info
    key_ptr = (void *)malloc(sizeof(key_len_t));
    memset(&keylen, 0xff, sizeof(key_len_t));
    _keylen = _endian_encode(keylen);
    memcpy(key_ptr, &_keylen, sizeof(key_len_t));
    memcpy(key, &key_ptr, sizeof(void *));
}